

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::FoundationPileWithTwoTest_isSnapshotOfSameObject_Test::TestBody
          (FoundationPileWithTwoTest_isSnapshotOfSameObject_Test *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  pointer pSVar4;
  type pSVar5;
  char *pcVar6;
  shared_ptr<solitaire::piles::FoundationPile> *this_00;
  char *in_R9;
  string local_1b8;
  AssertHelper local_198;
  Message local_190;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  SnapshotMock snapshotOfDifferentTypeObject;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  local_38;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  snapshotOfSameTypeObject;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  snapshotOfSameObject;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  local_18;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  snapshot;
  FoundationPileWithTwoTest_isSnapshotOfSameObject_Test *this_local;
  
  this_00 = &(this->super_FoundationPileWithTwoTest).super_FoundationPileWithAceTest.
             super_EmptyFoundationPileTest.pile;
  snapshot._M_t.
  super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl =
       (__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
        )(__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
          )this;
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_00);
  (*(peVar3->super_FoundationPile).super_Archiver._vptr_Archiver[2])(&local_18);
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_00);
  (*(peVar3->super_FoundationPile).super_Archiver._vptr_Archiver[3])();
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_FoundationPileWithTwoTest).super_FoundationPileWithAceTest.
                            super_EmptyFoundationPileTest.pile);
  (*(peVar3->super_FoundationPile).super_Archiver._vptr_Archiver[2])(&snapshotOfSameTypeObject);
  std::make_shared<solitaire::piles::FoundationPile>();
  peVar3 = std::
           __shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&snapshotOfDifferentTypeObject.gmock11_isSnapshotOfSameObject_12.
                            super_UntypedFunctionMockerBase.untyped_expectations_.
                            super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (*(peVar3->super_FoundationPile).super_Archiver._vptr_Archiver[2])(&local_38);
  std::shared_ptr<solitaire::piles::FoundationPile>::~shared_ptr
            ((shared_ptr<solitaire::piles::FoundationPile> *)
             &snapshotOfDifferentTypeObject.gmock11_isSnapshotOfSameObject_12.
              super_UntypedFunctionMockerBase.untyped_expectations_.
              super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  archivers::SnapshotMock::SnapshotMock((SnapshotMock *)&gtest_ar_.message_);
  pSVar4 = std::
           unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
           ::operator->(&local_18);
  pSVar5 = std::
           unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
           ::operator*(&snapshotOfSameTypeObject);
  iVar2 = (*pSVar4->_vptr_Snapshot[3])(pSVar4,pSVar5);
  local_f1 = (bool)((byte)iVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_f0,
               (AssertionResult *)"snapshot->isSnapshotOfSameObject(*snapshotOfSameObject)","false",
               "true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0xae,pcVar6);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  pSVar4 = std::
           unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
           ::operator->(&local_18);
  pSVar5 = std::
           unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
           ::operator*(&local_38);
  iVar2 = (*pSVar4->_vptr_Snapshot[3])(pSVar4,pSVar5);
  local_139 = (bool)(~(byte)iVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_138,
               (AssertionResult *)"snapshot->isSnapshotOfSameObject(*snapshotOfSameTypeObject)",
               "true","false",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0xaf,pcVar6);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  pSVar4 = std::
           unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
           ::operator->(&local_18);
  iVar2 = (*pSVar4->_vptr_Snapshot[3])(pSVar4,&gtest_ar_.message_);
  local_181 = (bool)(~(byte)iVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_180,&local_181,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b8,(internal *)local_180,
               (AssertionResult *)"snapshot->isSnapshotOfSameObject(snapshotOfDifferentTypeObject)",
               "true","false",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0xb0,pcVar6);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  archivers::SnapshotMock::~SnapshotMock((SnapshotMock *)&gtest_ar_.message_);
  std::
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ::~unique_ptr(&local_38);
  std::
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ::~unique_ptr(&snapshotOfSameTypeObject);
  std::
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ::~unique_ptr(&local_18);
  return;
}

Assistant:

TEST_F(FoundationPileWithTwoTest, isSnapshotOfSameObject) {
    const auto snapshot = pile->createSnapshot();
    pile->initialize();
    const auto snapshotOfSameObject = pile->createSnapshot();
    const auto snapshotOfSameTypeObject = std::make_shared<FoundationPile>()->createSnapshot();
    SnapshotMock snapshotOfDifferentTypeObject;

    EXPECT_TRUE(snapshot->isSnapshotOfSameObject(*snapshotOfSameObject));
    EXPECT_FALSE(snapshot->isSnapshotOfSameObject(*snapshotOfSameTypeObject));
    EXPECT_FALSE(snapshot->isSnapshotOfSameObject(snapshotOfDifferentTypeObject));
}